

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O3

void AM_drawSubsectors(void)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  F3DFloor *pFVar5;
  secplane_t *psVar6;
  FTexture *pFVar7;
  sector_t *psVar8;
  TVector2<float> TVar9;
  DVector3 *pDVar10;
  double dVar11;
  int iVar12;
  int iVar13;
  subsector_t *psVar14;
  undefined4 extraout_var;
  lightlist_t *plVar15;
  FDynamicColormap **ppFVar16;
  FDynamicColormap *pFVar17;
  uint uVar18;
  int iVar19;
  extsector_t *peVar20;
  ulong uVar21;
  ulong uVar22;
  secplane_t *plane;
  DVector3 *pDVar23;
  long lVar24;
  long lVar25;
  bool bVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  int floorlight;
  mpoint_t originpt;
  undefined8 local_2c8;
  undefined1 local_2a8 [8];
  double dStack_2a0;
  double local_298;
  double local_290;
  double local_288;
  double local_280;
  double local_278;
  double local_270;
  DAngle local_268;
  int ceilinglight;
  double local_258;
  double dStack_250;
  sector_t_conflict tempsec;
  sector_t_conflict *sector;
  
  if (AM_drawSubsectors()::points == '\0') {
    AM_drawSubsectors();
  }
  dVar11 = scale_mtof;
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x10])();
  if (0 < numsubsectors) {
    lVar24 = 0;
    do {
      if ((((subsectors[lVar24].flags & 4U) == 0) &&
          ((((subsectors[lVar24].flags & 2U) != 0 &&
            (((subsectors[lVar24].render_sector)->MoreFlags & 0x100) == 0)) || (am_cheat.Value != 0)
           ))) && (((am_portaloverlay.Value != true ||
                    (iVar12 = (subsectors[lVar24].render_sector)->PortalGroup, iVar12 == 0)) ||
                   (iVar12 == MapPortalGroup)))) {
        uVar4 = subsectors[lVar24].numlines;
        uVar18 = uVar4;
        if (AM_drawSubsectors::points.Count <= uVar4 && uVar4 - AM_drawSubsectors::points.Count != 0
           ) {
          TArray<TVector2<float>,_TVector2<float>_>::Grow
                    (&AM_drawSubsectors::points,uVar4 - AM_drawSubsectors::points.Count);
          uVar18 = subsectors[lVar24].numlines;
        }
        psVar14 = subsectors;
        AM_drawSubsectors::points.Count = uVar4;
        if (uVar18 != 0) {
          lVar25 = 0;
          uVar22 = 0;
          iVar12 = am_rotate.Value;
          do {
            _local_2a8 = **(undefined1 (**) [16])((long)&(psVar14[lVar24].firstline)->v1 + lVar25);
            uVar27 = local_2a8._0_4_;
            uVar28 = local_2a8._4_4_;
            if ((iVar12 == 1) || ((iVar12 == 2 && (iVar12 = 2, viewactive == true)))) {
              AM_rotatePoint((double *)local_2a8,(double *)(local_2a8 + 8));
              uVar27 = local_2a8._0_4_;
              uVar28 = local_2a8._4_4_;
              psVar14 = subsectors;
              iVar12 = am_rotate.Value;
            }
            TVar9.Y = (float)((double)f_y + ((double)f_h - (dStack_2a0 - m_y) * dVar11));
            TVar9.X = (float)((double)f_x + ((double)CONCAT44(uVar28,uVar27) - m_x) * dVar11);
            AM_drawSubsectors::points.Array[uVar22] = TVar9;
            uVar22 = uVar22 + 1;
            lVar25 = lVar25 + 0x30;
          } while (uVar22 < psVar14[lVar24].numlines);
        }
        iVar12 = (*Renderer->_vptr_FRenderer[0x14])
                           (Renderer,psVar14[lVar24].render_sector,&tempsec,&floorlight,
                            &ceilinglight,0);
        sector = (sector_t_conflict *)CONCAT44(extraout_var,iVar12);
        originpt.x = (double)((ulong)sector->planes[0].xform.xOffs ^ (ulong)DAT_005d6f40);
        originpt.y = sector->planes[0].xform.yOffs + sector->planes[0].xform.baseyOffs;
        uVar22 = (ulong)(sector->planes[0].xform.baseAngle.Degrees +
                        sector->planes[0].xform.Angle.Degrees) ^ (ulong)DAT_005d6f40;
        local_2c8._0_4_ = (undefined4)uVar22;
        local_2c8._4_4_ = (undefined4)(uVar22 >> 0x20);
        iVar12 = sector->planes[0].Texture.texnum;
        local_258 = sector->planes[0].xform.xScale;
        dStack_250 = sector->planes[0].xform.yScale;
        peVar20 = sector->e;
        uVar4 = (peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
        uVar21 = (ulong)uVar4;
        if (uVar4 == 0) {
          ppFVar16 = &sector->ColorMap;
        }
        else {
          lVar25 = (&DAT_017e1fb8)[(long)consoleplayer * 0x54];
          if (lVar25 == 0) {
LAB_003486ba:
            pDVar23 = (DVector3 *)&sector->centerspot;
            pDVar10 = (DVector3 *)&sector->centerspot;
          }
          else {
            if ((*(byte *)(lVar25 + 0x20) & 0x20) != 0) {
              (&DAT_017e1fb8)[(long)consoleplayer * 0x54] = 0;
              peVar20 = sector->e;
              uVar21 = (ulong)(peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
              goto LAB_003486ba;
            }
            if (sector != *(sector_t_conflict **)(lVar25 + 0x130)) goto LAB_003486ba;
            pDVar23 = &ViewPos;
            pDVar10 = &ViewPos;
          }
          plane = &sector->floorplane;
          local_2c8 = (double)uVar22;
          if ((int)uVar21 != 0) {
            dVar2 = pDVar23->X;
            dVar3 = pDVar10->Y;
            uVar22 = 0;
            do {
              pFVar5 = (peVar20->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar22];
              if (((pFVar5->flags & 0x1009) == 9) && (pFVar5->alpha != 0)) {
                psVar6 = (pFVar5->top).plane;
                dVar30 = ((psVar6->normal).Y * dVar3 + psVar6->D + (psVar6->normal).X * dVar2) *
                         psVar6->negiC;
                if (dVar30 <= (dVar3 * (sector->ceilingplane).normal.Y +
                              (sector->ceilingplane).normal.X * dVar2 + (sector->ceilingplane).D) *
                              (sector->ceilingplane).negiC) {
                  if (dVar30 < ((sector->floorplane).normal.Y * dVar3 +
                               (sector->floorplane).normal.X * dVar2 + (sector->floorplane).D) *
                               (sector->floorplane).negiC) break;
                  if (dVar30 < ViewPos.Z) {
                    psVar8 = (pFVar5->top).model;
                    iVar12 = ((pFVar5->top).texture)->texnum;
                    bVar26 = (pFVar5->flags >> 0xd & 1) == 0;
                    pdVar1 = &psVar8->planes[bVar26].xform.xScale;
                    local_258 = *pdVar1;
                    dStack_250 = pdVar1[1];
                    originpt.x = (double)((ulong)psVar8->planes[bVar26].xform.xOffs ^
                                         (ulong)DAT_005d6f40);
                    originpt.y = psVar8->planes[bVar26].xform.yOffs +
                                 psVar8->planes[bVar26].xform.baseyOffs;
                    plane = psVar6;
                    local_2c8 = (double)((ulong)(psVar8->planes[bVar26].xform.baseAngle.Degrees +
                                                psVar8->planes[bVar26].xform.Angle.Degrees) ^
                                        (ulong)DAT_005d6f40);
                    break;
                  }
                }
              }
              uVar22 = uVar22 + 1;
            } while (uVar21 != uVar22);
          }
          plVar15 = P_GetPlaneLight(sector,plane,false);
          floorlight = (int)*plVar15->p_lightlevel;
          ppFVar16 = &plVar15->extra_colormap;
        }
        if (iVar12 != skyflatnum.texnum) {
          pFVar17 = *ppFVar16;
          if (((double)CONCAT44(local_2c8._4_4_,(undefined4)local_2c8) != 0.0) ||
             (NAN((double)CONCAT44(local_2c8._4_4_,(undefined4)local_2c8)))) {
            local_268.Degrees = (double)CONCAT44(local_2c8._4_4_,(undefined4)local_2c8);
            AM_rotate(&originpt.x,&originpt.y,&local_268);
          }
          if ((am_rotate.Value == 1) || ((am_rotate.Value == 2 && (viewactive == true)))) {
            local_2c8 = ((double)CONCAT44(local_2c8._4_4_,(undefined4)local_2c8) + 90.0) -
                        *(double *)((&DAT_017e1fb8)[(long)consoleplayer * 0x54] + 0xb0);
            AM_rotatePoint(&originpt.x,&originpt.y);
          }
          dVar29 = (double)f_h;
          dVar31 = (double)f_y;
          dVar2 = (double)f_x;
          dVar3 = originpt.x - m_x;
          dVar30 = originpt.y - m_y;
          if ((subsectors[lVar24].flags & 2) == 0) {
            iVar19 = 0xff - pFVar17->Desaturate;
            iVar13 = 0x102 - pFVar17->Desaturate;
            if (-1 < iVar19) {
              iVar13 = iVar19;
            }
            local_298 = (double)f_x;
            local_290 = (double)f_y;
            local_288 = originpt.y - m_y;
            local_280 = (double)f_h;
            local_278 = originpt.x - m_x;
            pFVar17 = GetSpecialLights((PalEntry)
                                       ((pFVar17->Color).field_0.field_0.b + 0xa0 >> 1 |
                                       (uint)(pFVar17->Color).field_0.field_0.g * 0x80 + 0x6400 &
                                       0xff00 | (uint)(pFVar17->Color).field_0.field_0.r * 0x8000 +
                                                0x7f8000 & 0xff0000),
                                       (PalEntry)(pFVar17->Fade).field_0.field_0,
                                       0xff - (iVar13 >> 2));
            iVar13 = floorlight + 0xbc7;
            if (-1 < floorlight + 3000) {
              iVar13 = floorlight + 3000;
            }
            floorlight = iVar13 >> 4;
            dVar29 = local_280;
            dVar31 = local_290;
            dVar2 = local_298;
            dVar3 = local_278;
            dVar30 = local_288;
          }
          if ((((ulong)(long)iVar12 < (ulong)TexMan.Textures.Count) &&
              (pFVar7 = TexMan.Textures.Array[TexMan.Translation.Array[iVar12]].Texture,
              pFVar7 != (FTexture *)0x0)) && (pFVar7->UseType != '\r')) {
            local_270 = local_2c8;
            (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x12])
                      (SUB84(dVar3 * dVar11 + dVar2,0),(dVar29 - dVar30 * dVar11) + dVar31,
                       SUB84(dVar11 / local_258,0),dVar11 / dStack_250,screen,pFVar7,
                       AM_drawSubsectors::points.Array,(ulong)AM_drawSubsectors::points.Count,
                       &local_270,pFVar17,(ulong)(uint)floorlight,(ulong)(uint)(f_h + f_y));
          }
        }
      }
      lVar24 = lVar24 + 1;
    } while (lVar24 < numsubsectors);
  }
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x11])();
  return;
}

Assistant:

void AM_drawSubsectors()
{
	static TArray<FVector2> points;
	double scale = scale_mtof;
	DAngle rotation;
	sector_t tempsec;
	int floorlight, ceilinglight;
	double scalex, scaley;
	double originx, originy;
	FDynamicColormap *colormap;
	mpoint_t originpt;

	screen->StartSimplePolys();
	for (int i = 0; i < numsubsectors; ++i)
	{
		if (subsectors[i].flags & SSECF_POLYORG)
		{
			continue;
		}

		if ((!(subsectors[i].flags & SSECF_DRAWN) || (subsectors[i].render_sector->MoreFlags & SECF_HIDDEN)) && am_cheat == 0)
		{
			continue;
		}

		if (am_portaloverlay && subsectors[i].render_sector->PortalGroup != MapPortalGroup && subsectors[i].render_sector->PortalGroup != 0)
		{
			continue;
		}

		// Fill the points array from the subsector.
		points.Resize(subsectors[i].numlines);
		for (DWORD j = 0; j < subsectors[i].numlines; ++j)
		{
			mpoint_t pt = { subsectors[i].firstline[j].v1->fX(),
							subsectors[i].firstline[j].v1->fY() };
			if (am_rotate == 1 || (am_rotate == 2 && viewactive))
			{
				AM_rotatePoint(&pt.x, &pt.y);
			}
			points[j].X = float(f_x + ((pt.x - m_x) * scale));
			points[j].Y = float(f_y + (f_h - (pt.y - m_y) * scale));
		}
		// For lighting and texture determination
		sector_t *sec = Renderer->FakeFlat(subsectors[i].render_sector, &tempsec, &floorlight, &ceilinglight, false);
		// Find texture origin.
		originpt.x = -sec->GetXOffset(sector_t::floor);
		originpt.y = sec->GetYOffset(sector_t::floor);
		rotation = -sec->GetAngle(sector_t::floor);
		// Coloring for the polygon
		colormap = sec->ColorMap;

		FTextureID maptex = sec->GetTexture(sector_t::floor);

		scalex = sec->GetXScale(sector_t::floor);
		scaley = sec->GetYScale(sector_t::floor);

		if (sec->e->XFloor.ffloors.Size())
		{
			secplane_t *floorplane = &sec->floorplane;

			// Look for the highest floor below the camera viewpoint.
			// Check the center of the subsector's sector. Do not check each
			// subsector separately because that might result in different planes for
			// different subsectors of the same sector which is not wanted here.
			// (Make the comparison in floating point to avoid overflows and improve performance.)
			double secx;
			double secy;
			double seczb, seczt;
			double cmpz = ViewPos.Z;

			if (players[consoleplayer].camera && sec == players[consoleplayer].camera->Sector)
			{
				// For the actual camera sector use the current viewpoint as reference.
				secx = ViewPos.X;
				secy = ViewPos.Y;
			}
			else
			{
				secx = sec->centerspot.X;
				secy = sec->centerspot.Y;
			}
			seczb = floorplane->ZatPoint(secx, secy);
			seczt = sec->ceilingplane.ZatPoint(secx, secy);

			for (unsigned int i = 0; i < sec->e->XFloor.ffloors.Size(); ++i)
			{
				F3DFloor *rover = sec->e->XFloor.ffloors[i];
				if (!(rover->flags & FF_EXISTS)) continue;
				if (rover->flags & FF_FOG) continue;
				if (!(rover->flags & FF_RENDERPLANES)) continue;
				if (rover->alpha == 0) continue;
				double roverz = rover->top.plane->ZatPoint(secx, secy);
				// Ignore 3D floors that are above or below the sector itself:
				// they are hidden. Since 3D floors are sorted top to bottom,
				// if we get below the sector floor, we can stop.
				if (roverz > seczt) continue;
				if (roverz < seczb) break;
				if (roverz < cmpz)
				{
					maptex = *(rover->top.texture);
					floorplane = rover->top.plane;
					sector_t *model = rover->top.model;
					int selector = (rover->flags & FF_INVERTPLANES) ? sector_t::floor : sector_t::ceiling;
					rotation = -model->GetAngle(selector);
					scalex = model->GetXScale(selector);
					scaley = model->GetYScale(selector);
					originpt.x = -model->GetXOffset(selector);
					originpt.y = model->GetYOffset(selector);
					break;
				}
			}

			lightlist_t *light = P_GetPlaneLight(sec, floorplane, false);
			floorlight = *light->p_lightlevel;
			colormap = light->extra_colormap;
		}
		if (maptex == skyflatnum)
		{
			continue;
		}

		// Apply the floor's rotation to the texture origin.
		if (rotation != 0)
		{
			AM_rotate(&originpt.x, &originpt.y, rotation);
		}
		// Apply the automap's rotation to the texture origin.
		if (am_rotate == 1 || (am_rotate == 2 && viewactive))
		{
			rotation = rotation + 90. - players[consoleplayer].camera->Angles.Yaw;
			AM_rotatePoint(&originpt.x, &originpt.y);
		}
		originx = f_x + ((originpt.x - m_x) * scale);
		originy = f_y + (f_h - (originpt.y - m_y) * scale);

		// If this subsector has not actually been seen yet (because you are cheating
		// to see it on the map), tint and desaturate it.
		if (!(subsectors[i].flags & SSECF_DRAWN))
		{
			colormap = GetSpecialLights(
				MAKERGB(
					(colormap->Color.r + 255) / 2,
					(colormap->Color.g + 200) / 2,
					(colormap->Color.b + 160) / 2),
				colormap->Fade,
				255 - (255 - colormap->Desaturate) / 4);
			floorlight = (floorlight + 200 * 15) / 16;
		}

		// Draw the polygon.
		FTexture *pic = TexMan(maptex);
		if (pic != NULL && pic->UseType != FTexture::TEX_Null)
		{
			screen->FillSimplePoly(TexMan(maptex),
				&points[0], points.Size(),
				originx, originy,
				scale / scalex,
				scale / scaley,
				rotation,
				colormap,
				floorlight,
				f_y + f_h
				);
		}
	}
	screen->FinishSimplePolys();
}